

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O0

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmGen7TextureCalc::Get2DTexOffsetAddressPerMip
          (GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  GMM_PLATFORM_INFO *pGVar1;
  WA_TABLE *pWVar2;
  uint32_t local_98;
  uint32_t local_94;
  uint local_88;
  uint32_t local_84;
  uint32_t Modulo10;
  uint32_t Width1;
  uint32_t Mip1Width;
  GMM_PLATFORM_INFO *pPlatform;
  uint uStack_50;
  uint8_t Compress;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t VAlign;
  uint32_t HAlign;
  uint32_t OffsetHeight;
  uint32_t MipHeight;
  uint32_t i;
  uint32_t AlignedMipHeight;
  GMM_GFX_SIZE_T MipOffset;
  GMM_TEXTURE_INFO *pGStack_20;
  uint32_t MipLevel_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen7TextureCalc *this_local;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local = (GmmGen7TextureCalc *)0x1;
  }
  else {
    MipOffset._4_4_ = MipLevel;
    pGStack_20 = pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    pGVar1 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
    CompressHeight = (pGStack_20->Alignment).HAlign;
    CompressWidth = (pGStack_20->Alignment).VAlign;
    GmmTextureCalc::GetCompressionBlockDimensions
              (&this->super_GmmTextureCalc,pGStack_20->Format,&stack0xffffffffffffffb0,
               &CompressDepth,(uint32_t *)((long)&pPlatform + 4));
    pPlatform._3_1_ =
         GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pGStack_20->Format);
    HAlign = pGStack_20->BaseHeight;
    VAlign = 0;
    if (MipOffset._4_4_ < 2) {
      _i = 0;
    }
    else {
      if ((((ulong)(pGStack_20->Flags).Gpu >> 6 & 1) == 0) &&
         (((ulong)(pGStack_20->Flags).Gpu >> 0x1d & 1) == 0)) {
        local_84 = 1;
      }
      else {
        local_84 = (pGStack_20->MSAA).NumSamples;
      }
      Modulo10 = GmmTextureCalc::ExpandWidth
                           (&this->super_GmmTextureCalc,
                            (uint)(pGStack_20->BaseWidth >> 1) & 0x7fffffff,CompressHeight,local_84)
      ;
      if (pPlatform._3_1_ == '\0') {
        if (((ulong)(pGStack_20->Flags).Gpu >> 0x1d & 1) != 0) {
          Modulo10 = Modulo10 << 1;
        }
      }
      else {
        Modulo10 = Modulo10 / uStack_50;
        pWVar2 = Context::GetWaTable((this->super_GmmTextureCalc).pGmmLibContext);
        if (((((*(ulong *)&pWVar2->field_0x4 >> 0x25 & 1) != 0) ||
             ((*(ushort *)&(pGStack_20->Flags).Wa >> 5 & 1) != 0)) &&
            (((uint)pGVar1->FormatTable[pGStack_20->Format].field_0 & 1) != 0)) && (uStack_50 == 5))
        {
          if (pGStack_20->BaseWidth == 1) {
            local_88 = 1;
          }
          else {
            local_88 = (uint)(pGStack_20->BaseWidth >> 1) & 0x7fffffff;
          }
          if ((local_88 % 10 != 0) && (local_88 % 10 < 6)) {
            Modulo10 = Modulo10 + 3;
          }
        }
      }
      _i = (ulong)Modulo10 * (ulong)pGStack_20->BitsPerPixel >> 3;
    }
    for (OffsetHeight = 1; OffsetHeight <= MipOffset._4_4_; OffsetHeight = OffsetHeight + 1) {
      if ((((ulong)(pGStack_20->Flags).Gpu >> 6 & 1) == 0) &&
         (((ulong)(pGStack_20->Flags).Gpu >> 0x1d & 1) == 0)) {
        local_94 = 1;
      }
      else {
        local_94 = (pGStack_20->MSAA).NumSamples;
      }
      MipHeight = GmmTextureCalc::ExpandHeight
                            (&this->super_GmmTextureCalc,HAlign,CompressWidth,local_94);
      if (pPlatform._3_1_ == '\0') {
        if (((ulong)(pGStack_20->Flags).Gpu >> 0x1d & 1) != 0) {
          MipHeight = MipHeight >> 1;
        }
      }
      else {
        MipHeight = MipHeight / CompressDepth;
      }
      if (OffsetHeight == 2) {
        local_98 = 0;
      }
      else {
        local_98 = MipHeight;
      }
      VAlign = local_98 + VAlign;
      HAlign = HAlign >> 1;
    }
    this_local = (GmmGen7TextureCalc *)(VAlign * (int)pGStack_20->Pitch + _i);
  }
  return (GMM_GFX_SIZE_T)this_local;
}

Assistant:

GMM_GFX_SIZE_T GmmLib::GmmGen7TextureCalc::Get2DTexOffsetAddressPerMip(GMM_TEXTURE_INFO *pTexInfo,
                                                                       uint32_t          MipLevel)
{
    GMM_GFX_SIZE_T MipOffset;
    uint32_t       AlignedMipHeight, i, MipHeight, OffsetHeight;
    uint32_t       HAlign, VAlign;
    uint32_t       CompressHeight, CompressWidth, CompressDepth;
    uint8_t        Compress;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    HAlign = pTexInfo->Alignment.HAlign;
    VAlign = pTexInfo->Alignment.VAlign;

    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    Compress = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    MipHeight    = pTexInfo->BaseHeight;
    OffsetHeight = 0;

    // Mips 0 and 1 are on the left edge...
    if(MipLevel < 2)
    {
        MipOffset = 0;
    }
    else // Mip2 and beyond are to the right of Mip1...
    {
        uint32_t Mip1Width = GFX_ULONG_CAST(pTexInfo->BaseWidth) >> 1;

        Mip1Width = __GMM_EXPAND_WIDTH(this, Mip1Width, HAlign, pTexInfo);

        if(Compress)
        {
            Mip1Width /= CompressWidth;
            
	    if((pGmmLibContext->GetWaTable().WaAstcCorruptionForOddCompressedBlockSizeX || pTexInfo->Flags.Wa.CHVAstcSkipVirtualMips) && pPlatform->FormatTable[pTexInfo->Format].ASTC && CompressWidth == 5)
            {
                uint32_t Width1   = (pTexInfo->BaseWidth == 1) ? 1 : (GFX_ULONG_CAST(pTexInfo->BaseWidth) >> 1);
                uint32_t Modulo10 = Width1 % 10;
                if(Modulo10 >= 1 && Modulo10 <= CompressWidth)
                {
                    Mip1Width += 3;
                }
            }
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            Mip1Width *= 2;
        }

        MipOffset = (GMM_GFX_SIZE_T)Mip1Width * pTexInfo->BitsPerPixel >> 3;
    }

    for(i = 1; i <= MipLevel; i++)
    {
        AlignedMipHeight = GFX_ULONG_CAST(__GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo));

        if(Compress)
        {
            AlignedMipHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            AlignedMipHeight /= 2;
        }

        OffsetHeight += ((i != 2) ? AlignedMipHeight : 0);

        MipHeight >>= 1;
    }

    MipOffset += OffsetHeight * GFX_ULONG_CAST(pTexInfo->Pitch);

    GMM_DPF_EXIT;
    return (MipOffset);
}